

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O1

int secp256k1_dleq_deserialize_point(secp256k1_ge *p,uchar *buf33)

{
  int iVar1;
  int iVar2;
  secp256k1_fe x;
  secp256k1_fe sStack_38;
  
  iVar1 = secp256k1_fe_set_b32(&sStack_38,buf33 + 1);
  iVar2 = 0;
  if ((iVar1 != 0) && (*buf33 < 2)) {
    secp256k1_ge_set_xo_var(p,&sStack_38,(uint)*buf33);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int secp256k1_dleq_deserialize_point(secp256k1_ge *p, const unsigned char *buf33) {
    secp256k1_fe x;

    if (!secp256k1_fe_set_b32(&x, &buf33[1])) {
        return 0;
    }
    if (buf33[0] > 1) {
        return 0;
    }
    secp256k1_ge_set_xo_var(p, &x, buf33[0]);
    return 1;
}